

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O3

ostream * operator<<(ostream *os,v_array<char> *v)

{
  ostream *poVar1;
  char *pcVar2;
  char local_2b;
  char local_2a [2];
  
  local_2a[1] = 0x5b;
  std::__ostream_insert<char,std::char_traits<char>>(os,local_2a + 1,1);
  pcVar2 = v->_begin;
  if (pcVar2 != v->_end) {
    do {
      local_2b = ' ';
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,&local_2b,1);
      local_2a[0] = *pcVar2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2a,1);
      pcVar2 = pcVar2 + 1;
    } while (pcVar2 != v->_end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," ]",2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const v_array<T>& v)
{
  os << '[';
  for (T* i = v._begin; i != v._end; ++i) os << ' ' << *i;
  os << " ]";
  return os;
}